

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::crate::CrateReader::BuildNodeHierarchy
          (CrateReader *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *pathIndexes,
          vector<int,_std::allocator<int>_> *elementTokenIndexes,
          vector<int,_std::allocator<int>_> *jumps,vector<bool,_std::allocator<bool>_> *visit_table,
          size_t _curIndex,int64_t _parentNodeIndex)

{
  Node *pNVar1;
  ulong *puVar2;
  int *piVar3;
  string *psVar4;
  uint uVar5;
  pointer puVar6;
  pointer pPVar7;
  pointer pNVar8;
  _Bit_type *p_Var9;
  uint *puVar10;
  pointer piVar11;
  bool bVar12;
  ulong uVar13;
  ostream *poVar14;
  long *plVar15;
  ulong uVar16;
  _Elt_pointer puVar17;
  int iVar18;
  long *plVar19;
  long lVar20;
  long *plVar21;
  char *pcVar22;
  ulong uVar23;
  ulong uVar24;
  int64_t parentNodeIndex;
  size_t subtreeEndIdx;
  string name;
  Node node;
  ostringstream ss_e_7;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> startIndexStack;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> endIndexStack;
  stack<long,_std::deque<long,_std::allocator<long>_>_> parentNodeIndexStack;
  long *local_580;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_578;
  long *local_570 [2];
  long local_560 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_500;
  CrateReader *local_4f8;
  string local_4f0;
  long *local_4d0;
  undefined1 local_4c8 [8];
  pointer local_4c0 [2];
  pointer local_4b0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_4a8;
  undefined1 local_470 [32];
  _Alloc_hider local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  _Alloc_hider local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  _Alloc_hider local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  _Alloc_hider local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  _Alloc_hider local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0 [2];
  Path local_3a0;
  Path *local_2d0;
  size_t local_2c8;
  long *local_2c0;
  long *local_2b8 [2];
  long local_2a8 [12];
  ios_base local_248 [264];
  vector<int,_std::allocator<int>_> *local_140;
  long *local_138;
  long local_130;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_128;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  _Deque_base<long,_std::allocator<long>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  uVar24 = 0;
  local_140 = jumps;
  ::std::_Deque_base<long,_std::allocator<long>_>::_M_initialize_map(&local_88,0);
  local_128._M_impl.super__Deque_impl_data._M_finish._M_last = (ulong *)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_cur = (ulong *)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_first = (ulong *)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_cur = (ulong *)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_map_size = 0;
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_128,0)
  ;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_last = (ulong *)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (ulong *)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_first = (ulong *)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_d8,0);
  local_2c8 = (this->_config).maxPathIndicesDecodeIteration;
  local_580 = (long *)_parentNodeIndex;
  if (local_2c8 != 0) {
    local_4d0 = (long *)(((long)(pathIndexes->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pathIndexes->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start >> 2) - 1);
    local_2d0 = &local_3a0;
    local_500 = &local_3a0._element.field_2;
    local_508 = &local_3a0._variant_part_str.field_2;
    local_510 = &local_3a0._variant_selection_part.field_2;
    local_518 = &local_3a0._variant_part.field_2;
    local_520 = &local_3a0._prop_part.field_2;
    local_528 = &local_3a0._prim_part.field_2;
    local_530 = local_3c0;
    local_538 = &local_3e0;
    local_540 = &local_400;
    local_548 = &local_420;
    local_550 = &local_440;
    psVar4 = &this->_err;
    uVar24 = 0;
    local_578 = pathIndexes;
    local_4f8 = this;
    do {
      bVar12 = true;
      plVar15 = (long *)_curIndex;
      if (_curIndex < (long *)((long)local_4d0 + 1U)) {
        do {
          local_2c0 = (long *)((long)plVar15 + 1);
          if (local_580 != (long *)0xffffffffffffffff) {
            puVar6 = (pathIndexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            plVar15 = (long *)((long)(pathIndexes->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 2
                              );
            if ((long)plVar15 <= (long)local_580) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
              poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0x130f);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
              lVar20 = 0x1a;
              pcVar22 = "Parent Index out-of-range.";
              goto LAB_001c2024;
            }
            if (plVar15 <= _curIndex) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
              iVar18 = 0x1313;
              goto LAB_001c1ffc;
            }
            uVar5 = puVar6[_curIndex];
            uVar23 = (ulong)uVar5;
            pPVar7 = (this->_paths).
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar13 = ((long)(this->_paths).
                            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pPVar7 >> 4) *
                     0x4ec4ec4ec4ec4ec5;
            if (uVar13 < uVar23 || uVar13 - uVar23 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
              iVar18 = 0x131b;
LAB_001c1408:
              poVar14 = (ostream *)::std::ostream::operator<<(local_4c8,iVar18);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
              lVar20 = 0x17;
              pcVar22 = "PathIndex out-of-range.";
LAB_001c14ed:
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,pcVar22,lVar20);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"\n",1);
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_2b8[0]);
              if (local_2b8[0] != local_2a8) {
                operator_delete(local_2b8[0],local_2a8[0] + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
              ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
              bVar12 = false;
            }
            else {
              pNVar8 = (this->_nodes).
                       super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar13 = ((long)(this->_nodes).
                              super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar8 >> 3) *
                       -0x1041041041041041;
              if (uVar13 < uVar23 || uVar13 - uVar23 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"[Crate]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
                iVar18 = 0x131f;
                goto LAB_001c1408;
              }
              p_Var9 = (visit_table->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              if ((ulong)(visit_table->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                  ((long)(visit_table->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  (long)p_Var9) * 8 <= uVar23) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"[Crate]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
                poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0x1324);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                lVar20 = 0x1d;
                pcVar22 = "[InternalError] out-of-range.";
                goto LAB_001c14ed;
              }
              local_138 = (long *)_curIndex;
              if ((p_Var9[uVar5 >> 6] >> (uVar23 & 0x3f) & 1) == 0) {
                if (pNVar8[uVar23]._parent != -2) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,"[Crate]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3)
                  ;
                  poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0x132e)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,"???: Maybe corrupted path hierarchy?.",0x25);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_2b8[0]);
                  if (local_2b8[0] != local_2a8) {
                    operator_delete(local_2b8[0],local_2a8[0] + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                  ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                  goto LAB_001c181e;
                }
                local_130 = uVar23 * 0xd0;
                Node::Node((Node *)local_4c8,(int64_t)local_580,pPVar7 + uVar23);
                pNVar8 = (this->_nodes).
                         super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pNVar1 = pNVar8 + uVar23;
                pNVar8 = pNVar8 + uVar23;
                pNVar8->_parent = (int64_t)local_4c8;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &pNVar8->_children,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c0);
                if ((Node *)local_4c8 != pNVar1) {
                  ::std::
                  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  ::
                  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              *)&pNVar1->_primChildren,&local_4a8);
                }
                Path::operator=(&pNVar1->_path,(Path *)local_470);
                Path::operator=(&pNVar1->_elemPath,local_2d0);
                this = local_4f8;
                puVar2 = (visit_table->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         (uVar5 >> 6);
                *puVar2 = *puVar2 | 1L << ((byte)uVar5 & 0x3f);
                pPVar7 = (local_4f8->_elemPaths).
                         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
                         .super__Vector_impl_data._M_start;
                uVar13 = ((long)(local_4f8->_elemPaths).
                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pPVar7 >> 4) *
                         0x4ec4ec4ec4ec4ec5;
                if (uVar13 < uVar23 || uVar13 - uVar23 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2b8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2b8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2b8,"[Crate]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2b8,"BuildNodeHierarchy",0x12);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"():",3)
                  ;
                  poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b8,0x1337)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2b8,"PathIndex out-of-range.",0x17);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::_M_append
                            ((char *)psVar4,(ulong)local_4f0._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
                    operator_delete(local_4f0._M_dataplus._M_p,
                                    local_4f0.field_2._M_allocated_capacity + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
                  ::std::ios_base::~ios_base(local_248);
                  pathIndexes = local_578;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a0._element._M_dataplus._M_p != local_500) goto LAB_001c1d08;
                }
                else {
                  Path::full_path_name_abi_cxx11_
                            (&local_4f0,
                             (Path *)((long)&(pPVar7->_prim_part)._M_dataplus._M_p + local_130));
                  pathIndexes = local_578;
                  puVar6 = (local_578->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  if (local_580 <
                      (long *)((long)(local_578->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 2
                              )) {
                    uVar13 = (ulong)puVar6[(long)local_580];
                    pNVar8 = (this->_nodes).
                             super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    uVar16 = ((long)(this->_nodes).
                                    super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar8 >> 3)
                             * -0x1041041041041041;
                    if (uVar16 < uVar13 || uVar16 - uVar13 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,"[Crate]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,"BuildNodeHierarchy",0x12);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b8,"():",3);
                      poVar14 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_2b8,0x1345);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                      lVar20 = 0x17;
                      pcVar22 = "PathIndex out-of-range.";
                      goto LAB_001c1b14;
                    }
                    bVar12 = Node::AddChildren(pNVar8 + uVar13,&local_4f0,uVar23);
                    if (bVar12) {
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
                        operator_delete(local_4f0._M_dataplus._M_p,
                                        local_4f0.field_2._M_allocated_capacity + 1);
                      }
                      _curIndex = (size_t)local_138;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3a0._element._M_dataplus._M_p != local_500) {
                        operator_delete(local_3a0._element._M_dataplus._M_p,
                                        local_3a0._element.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3a0._variant_part_str._M_dataplus._M_p != local_508) {
                        operator_delete(local_3a0._variant_part_str._M_dataplus._M_p,
                                        local_3a0._variant_part_str.field_2._M_allocated_capacity +
                                        1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3a0._variant_selection_part._M_dataplus._M_p != local_510) {
                        operator_delete(local_3a0._variant_selection_part._M_dataplus._M_p,
                                        local_3a0._variant_selection_part.field_2.
                                        _M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3a0._variant_part._M_dataplus._M_p != local_518) {
                        operator_delete(local_3a0._variant_part._M_dataplus._M_p,
                                        local_3a0._variant_part.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3a0._prop_part._M_dataplus._M_p != local_520) {
                        operator_delete(local_3a0._prop_part._M_dataplus._M_p,
                                        local_3a0._prop_part.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3a0._prim_part._M_dataplus._M_p != local_528) {
                        operator_delete(local_3a0._prim_part._M_dataplus._M_p,
                                        local_3a0._prim_part.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3d0._M_p != local_530) {
                        operator_delete(local_3d0._M_p,local_3c0[0]._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3f0._M_p != local_538) {
                        operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_410._M_p != local_540) {
                        operator_delete(local_410._M_p,local_400._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_430._M_p != local_548) {
                        operator_delete(local_430._M_p,local_420._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_450._M_p != local_550) {
                        operator_delete(local_450._M_p,local_440._M_allocated_capacity + 1);
                      }
                      if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
                        operator_delete((void *)local_470._0_8_,local_470._16_8_ + 1);
                      }
                      ::std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::~_Hashtable(&local_4a8);
                      if (local_4c0[0] != (pointer)0x0) {
                        operator_delete(local_4c0[0],(long)local_4b0 - (long)local_4c0[0]);
                      }
                      goto LAB_001c0ad4;
                    }
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                               ,0x56);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,"[Crate]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,"BuildNodeHierarchy",0x12);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,"():",3);
                    poVar14 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_2b8,0x134a);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,"Invalid path index.",0x13);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,"\n",1);
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_570[0]);
                    if (local_570[0] != local_560) {
                      operator_delete(local_570[0],local_560[0] + 1);
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
                    ::std::ios_base::~ios_base(local_248);
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                               ,0x56);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,"[Crate]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,"BuildNodeHierarchy",0x12);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,"():",3);
                    poVar14 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_2b8,0x1340);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                    lVar20 = 0x1b;
                    pcVar22 = "ParentNodeIdx out-of-range.";
LAB_001c1b14:
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,pcVar22,lVar20);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b8,"\n",1);
                    ::std::__cxx11::stringbuf::str();
                    ::std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_570[0]);
                    if (local_570[0] != local_560) {
                      operator_delete(local_570[0],local_560[0] + 1);
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
                    ::std::ios_base::~ios_base(local_248);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
                    operator_delete(local_4f0._M_dataplus._M_p,
                                    local_4f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a0._element._M_dataplus._M_p != local_500) {
LAB_001c1d08:
                    operator_delete(local_3a0._element._M_dataplus._M_p,
                                    local_3a0._element.field_2._M_allocated_capacity + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a0._variant_part_str._M_dataplus._M_p != local_508) {
                  operator_delete(local_3a0._variant_part_str._M_dataplus._M_p,
                                  local_3a0._variant_part_str.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a0._variant_selection_part._M_dataplus._M_p != local_510) {
                  operator_delete(local_3a0._variant_selection_part._M_dataplus._M_p,
                                  local_3a0._variant_selection_part.field_2._M_allocated_capacity +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a0._variant_part._M_dataplus._M_p != local_518) {
                  operator_delete(local_3a0._variant_part._M_dataplus._M_p,
                                  local_3a0._variant_part.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a0._prop_part._M_dataplus._M_p != local_520) {
                  operator_delete(local_3a0._prop_part._M_dataplus._M_p,
                                  local_3a0._prop_part.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a0._prim_part._M_dataplus._M_p != local_528) {
                  operator_delete(local_3a0._prim_part._M_dataplus._M_p,
                                  local_3a0._prim_part.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d0._M_p != local_530) {
                  operator_delete(local_3d0._M_p,local_3c0[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3f0._M_p != local_538) {
                  operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_410._M_p != local_540) {
                  operator_delete(local_410._M_p,local_400._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_430._M_p != local_548) {
                  operator_delete(local_430._M_p,local_420._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_450._M_p != local_550) {
                  operator_delete(local_450._M_p,local_440._M_allocated_capacity + 1);
                }
                if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
                  operator_delete((void *)local_470._0_8_,local_470._16_8_ + 1);
                }
                ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::~_Hashtable(&local_4a8);
                if (local_4c0[0] != (pointer)0x0) {
                  operator_delete(local_4c0[0],(long)local_4b0 - (long)local_4c0[0]);
                }
LAB_001c20b1:
                bVar12 = false;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"[Crate]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
                poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0x1328);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,
                           "Circular referencing detected. Invalid Prim tree representation.",0x40);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"\n",1);
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_2b8[0]);
                if (local_2b8[0] != local_2a8) {
                  operator_delete(local_2b8[0],local_2a8[0] + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
LAB_001c181e:
                bVar12 = false;
              }
            }
            goto LAB_001c235b;
          }
          if ((long *)_curIndex != (long *)0x0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
            poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0x12eb);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
            lVar20 = 0x1a;
            pcVar22 = "TODO: Multiple root nodes.";
LAB_001c2024:
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,pcVar22,lVar20);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_2b8[0]);
            if (local_2b8[0] != local_2a8) {
              operator_delete(local_2b8[0],local_2a8[0] + 1);
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
            ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
            goto LAB_001c20b1;
          }
          puVar10 = (pathIndexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if ((pathIndexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
              .super__Vector_impl_data._M_finish == puVar10) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
            iVar18 = 0x12ef;
LAB_001c1ffc:
            poVar14 = (ostream *)::std::ostream::operator<<(local_4c8,iVar18);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
            lVar20 = 0x13;
            pcVar22 = "Index out-of-range.";
            goto LAB_001c2024;
          }
          uVar5 = *puVar10;
          uVar23 = (ulong)uVar5;
          pPVar7 = (this->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar13 = ((long)(this->_paths).
                          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pPVar7 >> 4) *
                   0x4ec4ec4ec4ec4ec5;
          if (uVar13 < uVar23 || uVar13 - uVar23 == 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
            iVar18 = 0x12f4;
LAB_001c21dd:
            poVar14 = (ostream *)::std::ostream::operator<<(local_4c8,iVar18);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
            lVar20 = 0x17;
            pcVar22 = "PathIndex out-of-range.";
LAB_001c22c2:
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,pcVar22,lVar20);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_2b8[0]);
            if (local_2b8[0] != local_2a8) {
              operator_delete(local_2b8[0],local_2a8[0] + 1);
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
            ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
LAB_001c2351:
            bVar12 = false;
            pathIndexes = local_578;
            goto LAB_001c235b;
          }
          uVar13 = ((long)(this->_nodes).
                          super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_nodes).
                          super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1041041041041041;
          if (uVar13 < uVar23 || uVar13 - uVar23 == 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
            iVar18 = 0x12f8;
            goto LAB_001c21dd;
          }
          p_Var9 = (visit_table->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          if ((ulong)(visit_table->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)(visit_table->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var9
              ) * 8 <= uVar23) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
            poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0x12fd);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
            lVar20 = 0x1d;
            pcVar22 = "[InternalError] out-of-range.";
            goto LAB_001c22c2;
          }
          if ((p_Var9[uVar5 >> 6] >> (uVar23 & 0x3f) & 1) != 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
            poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0x1301);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,
                       "Circular referencing detected. Invalid Prim tree representation.",0x40);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_2b8[0]);
            if (local_2b8[0] != local_2a8) {
              operator_delete(local_2b8[0],local_2a8[0] + 1);
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
            ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
            this = local_4f8;
            goto LAB_001c2351;
          }
          Node::Node((Node *)local_4c8,-1,pPVar7 + uVar23);
          pNVar8 = (local_4f8->_nodes).
                   super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pNVar8[uVar23]._parent = (int64_t)local_4c8;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                    (&pNVar8[uVar23]._children,local_4c0);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::_M_move_assign(&pNVar8[uVar23]._primChildren._M_h,&local_4a8);
          Path::operator=(&pNVar8[uVar23]._path,(Path *)local_470);
          Path::operator=(&pNVar8[uVar23]._elemPath,local_2d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._element._M_dataplus._M_p != local_500) {
            operator_delete(local_3a0._element._M_dataplus._M_p,
                            local_3a0._element.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._variant_part_str._M_dataplus._M_p != local_508) {
            operator_delete(local_3a0._variant_part_str._M_dataplus._M_p,
                            local_3a0._variant_part_str.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._variant_selection_part._M_dataplus._M_p != local_510) {
            operator_delete(local_3a0._variant_selection_part._M_dataplus._M_p,
                            local_3a0._variant_selection_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._variant_part._M_dataplus._M_p != local_518) {
            operator_delete(local_3a0._variant_part._M_dataplus._M_p,
                            local_3a0._variant_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._prop_part._M_dataplus._M_p != local_520) {
            operator_delete(local_3a0._prop_part._M_dataplus._M_p,
                            local_3a0._prop_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._prim_part._M_dataplus._M_p != local_528) {
            operator_delete(local_3a0._prim_part._M_dataplus._M_p,
                            local_3a0._prim_part.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d0._M_p != local_530) {
            operator_delete(local_3d0._M_p,local_3c0[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f0._M_p != local_538) {
            operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_p != local_540) {
            operator_delete(local_410._M_p,local_400._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_430._M_p != local_548) {
            operator_delete(local_430._M_p,local_420._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_450._M_p != local_550) {
            operator_delete(local_450._M_p,local_440._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
            operator_delete((void *)local_470._0_8_,local_470._16_8_ + 1);
          }
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_4a8);
          if (local_4c0[0] != (pointer)0x0) {
            operator_delete(local_4c0[0],(long)local_4b0 - (long)local_4c0[0]);
          }
          puVar2 = (visit_table->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar5 >> 6);
          *puVar2 = *puVar2 | 1L << ((byte)uVar5 & 0x3f);
          local_580 = (long *)0x0;
          this = local_4f8;
          pathIndexes = local_578;
LAB_001c0ad4:
          piVar11 = (local_140->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          plVar15 = (long *)((long)(local_140->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar11 >> 2);
          if (plVar15 <= _curIndex) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
            poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0x134f);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
            lVar20 = 0x15;
            pcVar22 = "Index is out-of-range";
            goto LAB_001c2024;
          }
          lVar20 = (long)piVar11[_curIndex];
          iVar18 = 0;
          if (0 < lVar20 || lVar20 == -1) {
            if (-1 < piVar11[_curIndex]) {
              plVar19 = (long *)(_curIndex + lVar20);
              if (plVar19 < plVar15) {
                bVar12 = true;
                local_570[0] = plVar19;
                local_4f0._M_dataplus._M_p = (pointer)plVar19;
                if (-2 < piVar11[(long)plVar19]) {
                  plVar21 = (long *)((long)local_2c0 + lVar20);
                  do {
                    bVar12 = plVar21 < plVar15;
                    if (!bVar12) goto LAB_001c0c70;
                    local_570[0] = (long *)((long)local_570[0] + 1);
                    piVar3 = piVar11 + (long)plVar21;
                    plVar21 = (long *)((long)plVar21 + 1);
                  } while (-2 < *piVar3);
                }
                plVar15 = local_570[0];
                if (!bVar12) {
LAB_001c0c70:
                  local_570[0] = plVar15;
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3)
                  ;
                  poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0x136f)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                  lVar20 = 0x1d;
                  pcVar22 = "jump indices seems corrupted.";
                  goto LAB_001c0d14;
                }
                iVar18 = 0;
                if (plVar19 <= local_570[0]) {
                  if (1 < piVar11[_curIndex]) {
                    local_4c8 = (undefined1  [8])(_curIndex + 1);
                    if (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        local_128._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                      ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                      _M_push_back_aux<unsigned_long>
                                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,
                                 (unsigned_long *)local_4c8);
                    }
                    else {
                      *local_128._M_impl.super__Deque_impl_data._M_finish._M_cur =
                           (unsigned_long)local_4c8;
                      local_128._M_impl.super__Deque_impl_data._M_finish._M_cur =
                           local_128._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                    }
                    local_4c8 = (undefined1  [8])((long)plVar19 - 1);
                    if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                      ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                      _M_push_back_aux<unsigned_long>
                                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,
                                 (unsigned_long *)local_4c8);
                    }
                    else {
                      *local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                           (unsigned_long)local_4c8;
                      local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                           local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                    }
                    local_4c8 = (undefined1  [8])_curIndex;
                    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                      ::std::deque<long,_std::allocator<long>_>::_M_push_back_aux<long>
                                ((deque<long,_std::allocator<long>_> *)&local_88,(long *)local_4c8);
                    }
                    else {
                      *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = _curIndex;
                      local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                           local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                    }
                  }
                  if (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      local_128._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                    ::std::deque<unsigned_long,std::allocator<unsigned_long>>::
                    _M_push_back_aux<unsigned_long_const&>
                              ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_128,
                               (unsigned_long *)&local_4f0);
                  }
                  else {
                    *local_128._M_impl.super__Deque_impl_data._M_finish._M_cur =
                         (unsigned_long)local_4f0._M_dataplus._M_p;
                    local_128._M_impl.super__Deque_impl_data._M_finish._M_cur =
                         local_128._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                  }
                  if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                    ::std::deque<unsigned_long,std::allocator<unsigned_long>>::
                    _M_push_back_aux<unsigned_long_const&>
                              ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_d8,
                               (unsigned_long *)local_570);
                  }
                  else {
                    *local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                         (unsigned_long)local_570[0];
                    local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                         local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                  }
                  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                    ::std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                              ((deque<long,std::allocator<long>> *)&local_88,(long *)&local_580);
                  }
                  else {
                    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (long)local_580;
                    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                  }
                  uVar24 = uVar24 + 1;
                  iVar18 = 4;
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
                poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0x135a);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                lVar20 = 0x15;
                pcVar22 = "jump index corrupted.";
LAB_001c0d14:
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,pcVar22,lVar20);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"\n",1);
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_2b8[0]);
                if (local_2b8[0] != local_2a8) {
                  operator_delete(local_2b8[0],local_2a8[0] + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                iVar18 = 1;
              }
              if (iVar18 != 0) goto LAB_001c0dbc;
            }
            iVar18 = 0;
            local_580 = (long *)_curIndex;
          }
LAB_001c0dbc:
          if (iVar18 != 0) goto LAB_001c1243;
          bVar12 = (long *)_curIndex != local_4d0;
          _curIndex = (size_t)(_curIndex + 1);
          plVar15 = local_2c0;
        } while (bVar12);
        iVar18 = 4;
LAB_001c1243:
        bVar12 = iVar18 == 4;
      }
LAB_001c235b:
      if (!bVar12) goto LAB_001c2650;
      if (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_128._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      puVar17 = local_128._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_128._M_impl.super__Deque_impl_data._M_finish._M_first) {
        puVar17 = local_128._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      _curIndex = puVar17[-1];
      if (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_128._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_128._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_128._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_128._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_128._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_128._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
        local_128._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_128._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
        local_128._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_128._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_128._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_128._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      puVar17 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        puVar17 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_4d0 = (long *)puVar17[-1];
      if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_d8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_d8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_d8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
        local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_d8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
        local_d8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_d8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
        local_580 = (long *)local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
             (_Elt_pointer)
             ((ulong *)local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40);
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             (_Elt_pointer)
             ((ulong *)local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f);
        local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_580 = (long *)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 < local_2c8);
  }
  bVar12 = true;
  if (local_2c8 <= uVar24) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c8,"BuildNodeHierarchy",0x12);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
    poVar14 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4c8,0x13a3);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4c8,"PathIndex tree Too deep.",0x18);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2b8[0]);
    if (local_2b8[0] != local_2a8) {
      operator_delete(local_2b8[0],local_2a8[0] + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
    ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
LAB_001c2650:
    bVar12 = false;
  }
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_d8);
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_128);
  ::std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base(&local_88);
  return bVar12;
}

Assistant:

bool CrateReader::BuildNodeHierarchy(
    std::vector<uint32_t> const &pathIndexes,
    std::vector<int32_t> const &elementTokenIndexes,
    std::vector<int32_t> const &jumps,
    std::vector<bool> &visit_table, /* inout */
    size_t _curIndex,
    int64_t _parentNodeIndex) {

  (void)elementTokenIndexes;

  std::stack<int64_t> parentNodeIndexStack;
  std::stack<size_t> startIndexStack;
  std::stack<size_t> endIndexStack;

  size_t nIter = 0;
  const size_t maxIter = _config.maxPathIndicesDecodeIteration;

  size_t startIndex = _curIndex;
  size_t endIndex = pathIndexes.size() - 1;
  int64_t parentNodeIndex = _parentNodeIndex;

  // NOTE: Need to indirectly lookup index through pathIndexes[] when accessing
  // `_nodes`
  while (nIter < maxIter) {

    for (size_t thisIndex = startIndex; thisIndex < (endIndex + 1); thisIndex++) {
      if (parentNodeIndex == -1) {
        // root node.
        // Assume single root node in the scene.
        //assert(thisIndex == 0);
        if (thisIndex != 0) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "TODO: Multiple root nodes.");
        }

        if (thisIndex >= pathIndexes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Index out-of-range.");
        }

        size_t pathIdx = pathIndexes[thisIndex];
        if (pathIdx >= _paths.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (pathIdx >= _nodes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (pathIdx >= visit_table.size()) {
          // This should not be happan though
          PUSH_ERROR_AND_RETURN_TAG(kTag, "[InternalError] out-of-range.");
        }

        if (visit_table[pathIdx]) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Circular referencing detected. Invalid Prim tree representation.");
        }

        _nodes[pathIdx] = Node(parentNodeIndex, _paths[pathIdx]);
        visit_table[pathIdx] = true;

        parentNodeIndex = int64_t(thisIndex);

      } else {
        //if (parentNodeIndex >= int64_t(_nodes.size())) {
        //  PUSH_ERROR_AND_RETURN_TAG(kTag, "Parent Index out-of-range.");
        //}

        if (parentNodeIndex >= int64_t(pathIndexes.size())) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Parent Index out-of-range.");
        }

        if (thisIndex >= pathIndexes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Index out-of-range.");
        }

        DCOUT("Hierarchy. parent[" << pathIndexes[size_t(parentNodeIndex)]
                                   << "].add_child = " << pathIndexes[thisIndex]);

        size_t pathIdx = pathIndexes[thisIndex];
        if (pathIdx >= _paths.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (pathIdx >= _nodes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (pathIdx >= visit_table.size()) {
          // This should not be happan though
          PUSH_ERROR_AND_RETURN_TAG(kTag, "[InternalError] out-of-range.");
        }

        if (visit_table[pathIdx]) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Circular referencing detected. Invalid Prim tree representation.");
        }


        // Ensure parent is not set yet.
        if (_nodes[pathIdx].GetParent() != -2) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "???: Maybe corrupted path hierarchy?.");
        }

        Node node(parentNodeIndex, _paths[pathIdx]);
        _nodes[pathIdx] = node;

        visit_table[pathIdx] = true;

        if (pathIdx >= _elemPaths.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        //std::string name = _paths[pathIndexes[thisIndex]].local_path_name();
        std::string name = _elemPaths[pathIdx].full_path_name();
        DCOUT("childName = " << name);

        size_t parentNodeIdx = size_t(parentNodeIndex);
        if (parentNodeIdx >= pathIndexes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "ParentNodeIdx out-of-range.");
        }

        size_t parentPathIdx = pathIndexes[parentNodeIdx];
        if (parentPathIdx >= _nodes.size()) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "PathIndex out-of-range.");
        }

        if (!_nodes[parentPathIdx].AddChildren(
            name, pathIdx)) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid path index.");
        }
      }

      if (thisIndex >= jumps.size()) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, "Index is out-of-range");
      }

      bool hasChild = (jumps[thisIndex] > 0) || (jumps[thisIndex] == -1);
      bool hasSibling = (jumps[thisIndex] >= 0);

      if (hasChild) {
        if (hasSibling) {
          auto siblingIndex = thisIndex + size_t(jumps[thisIndex]);

          if (siblingIndex >= jumps.size()) {
            PUSH_ERROR_AND_RETURN("jump index corrupted.");
          }

          // Find subtree end.
          size_t subtreeStartIdx = siblingIndex;
          size_t subtreeIdx = subtreeStartIdx;

          for (; subtreeIdx < jumps.size(); subtreeIdx++) {

            bool has_child = (jumps[subtreeIdx] > 0) || (jumps[subtreeIdx] == -1);
            bool has_sibling = (jumps[subtreeIdx] >= 0);

            if (has_child || has_sibling) {
              continue;
            }
            break;
          }

          size_t subtreeEndIdx = subtreeIdx;
          if (subtreeEndIdx >= jumps.size()) {
            // Guess corrupted.
            PUSH_ERROR_AND_RETURN("jump indices seems corrupted.");
          }

          DCOUT("subtree startIdx " << subtreeStartIdx << ", subtree endIndex " << subtreeEndIdx);

          if (subtreeEndIdx >= subtreeStartIdx) {

            // index range after traversing subtree
            if (jumps[thisIndex] > 1) {
                startIndexStack.push(thisIndex+1);
                // jumps should be always positive, so no siblingIndex < thisIndex
                endIndexStack.push(siblingIndex-1); // endIndex is inclusive so subtract 1.
                parentNodeIndexStack.push(int64_t(thisIndex));
            }

            startIndexStack.push(subtreeStartIdx);
            endIndexStack.push(subtreeEndIdx);
            parentNodeIndexStack.push(parentNodeIndex);

            DCOUT("stack size: " << startIndexStack.size());

            nIter++;

            break; // goto `(A)`
          }

        }
        // Have a child (may have also had a sibling). Reset parent node index
        parentNodeIndex = int64_t(thisIndex);
        DCOUT("parentNodeIndex = " << parentNodeIndex);
      }
    }

    // (A)

    if (startIndexStack.empty()) {
      break; // end traversal
    }

    startIndex = startIndexStack.top();
    startIndexStack.pop();

    endIndex = endIndexStack.top();
    endIndexStack.pop();

    parentNodeIndex = parentNodeIndexStack.top();
    parentNodeIndexStack.pop();

    nIter++;
  }

  if (nIter >= maxIter) {
    PUSH_ERROR_AND_RETURN("PathIndex tree Too deep.");
  }

  return true;
}